

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeQuadSensSVtolerances(void *cvode_mem,sunrealtype reltolQS,N_Vector *abstolQS)

{
  double *pdVar1;
  int iVar2;
  void *__ptr;
  N_Vector *pp_Var3;
  int *piVar4;
  long in_RSI;
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  undefined8 uVar5;
  sunrealtype *atolmin;
  int retval;
  int is;
  CVodeMem cv_mem;
  int local_2c;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x9d0,"CVodeQuadSensSVtolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_SensMallocDone == 0) {
    cvProcessError(in_RDI,-0x28,0x9d9,"CVodeQuadSensSVtolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Forward sensitivity analysis not activated.");
    local_4 = -0x28;
  }
  else if (in_RDI->cv_QuadSensMallocDone == 0) {
    cvProcessError(in_RDI,-0x32,0x9e2,"CVodeQuadSensSVtolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Forward sensitivity analysis for quadrature variables not activated.");
    local_4 = -0x1e;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (in_RSI == 0) {
      cvProcessError(in_RDI,-0x16,0x9f2,"CVodeQuadSensSVtolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"abstolQS = NULL illegal.");
      local_4 = -0x16;
    }
    else if (in_RDI->cv_tempv->ops->nvmin == (_func_sunrealtype_N_Vector *)0x0) {
      cvProcessError(in_RDI,-0x16,0x9f9,"CVodeQuadSensSVtolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"Missing N_VMin routine from N_Vector");
      local_4 = -0x16;
    }
    else {
      __ptr = malloc((long)in_RDI->cv_Ns << 3);
      for (local_2c = 0; local_2c < in_RDI->cv_Ns; local_2c = local_2c + 1) {
        uVar5 = N_VMin(*(undefined8 *)(in_RSI + (long)local_2c * 8));
        *(undefined8 *)((long)__ptr + (long)local_2c * 8) = uVar5;
        pdVar1 = (double *)((long)__ptr + (long)local_2c * 8);
        if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
          cvProcessError(in_RDI,-0x16,0xa03,"CVodeQuadSensSVtolerances",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                         ,"abstolQS has negative component(s) (illegal).");
          free(__ptr);
          return -0x16;
        }
      }
      in_RDI->cv_itolQS = 2;
      in_RDI->cv_reltolQS = in_XMM0_Qa;
      if (in_RDI->cv_VabstolQSMallocDone == 0) {
        pp_Var3 = (N_Vector *)N_VCloneVectorArray(in_RDI->cv_Ns,in_RDI->cv_tempvQ);
        in_RDI->cv_VabstolQS = pp_Var3;
        piVar4 = (int *)malloc((long)in_RDI->cv_Ns << 2);
        in_RDI->cv_atolQSmin0 = piVar4;
        in_RDI->cv_lrw = (long)in_RDI->cv_Ns * in_RDI->cv_lrw1Q + in_RDI->cv_lrw;
        in_RDI->cv_liw = (long)in_RDI->cv_Ns * in_RDI->cv_liw1Q + in_RDI->cv_liw;
        in_RDI->cv_VabstolQSMallocDone = 1;
      }
      for (local_2c = 0; local_2c < in_RDI->cv_Ns; local_2c = local_2c + 1) {
        in_RDI->cv_cvals[local_2c] = 1.0;
        in_RDI->cv_atolQSmin0[local_2c] =
             (uint)(*(double *)((long)__ptr + (long)local_2c * 8) == 0.0);
      }
      free(__ptr);
      iVar2 = N_VScaleVectorArray(in_RDI->cv_Ns,in_RDI->cv_cvals,in_RSI,in_RDI->cv_VabstolQS);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x9eb,"CVodeQuadSensSVtolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"reltolQS < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeQuadSensSVtolerances(void* cvode_mem, sunrealtype reltolQS,
                              N_Vector* abstolQS)
{
  CVodeMem cv_mem;
  int is, retval;
  sunrealtype* atolmin;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* check if sensitivity was initialized */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  /* Ckeck if quadrature sensitivity was initialized? */

  if (cv_mem->cv_QuadSensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUAD);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOLQS);
    return (CV_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_ABSTOLQS);
    return (CV_ILL_INPUT);
  }

  if (cv_mem->cv_tempv->ops->nvmin == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Missing N_VMin routine from N_Vector");
    return (CV_ILL_INPUT);
  }
  atolmin = (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    atolmin[is] = N_VMin(abstolQS[is]);
    if (atolmin[is] < ZERO)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_ABSTOLQS);
      free(atolmin);
      return (CV_ILL_INPUT);
    }
  }

  /* Copy tolerances into memory */

  cv_mem->cv_itolQS = CV_SV;

  cv_mem->cv_reltolQS = reltolQS;

  if (!(cv_mem->cv_VabstolQSMallocDone))
  {
    cv_mem->cv_VabstolQS = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempvQ);
    cv_mem->cv_atolQSmin0 =
      (sunbooleantype*)malloc(cv_mem->cv_Ns * sizeof(sunbooleantype));
    cv_mem->cv_lrw += cv_mem->cv_Ns * cv_mem->cv_lrw1Q;
    cv_mem->cv_liw += cv_mem->cv_Ns * cv_mem->cv_liw1Q;
    cv_mem->cv_VabstolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    cv_mem->cv_cvals[is]      = ONE;
    cv_mem->cv_atolQSmin0[is] = (atolmin[is] == ZERO);
  }
  free(atolmin);

  retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals, abstolQS,
                               cv_mem->cv_VabstolQS);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  return (CV_SUCCESS);
}